

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf,size_t body_size)

{
  int iVar1;
  uint8_t *puVar2;
  size_t __n;
  int ret;
  size_t sizelen;
  uint8_t sizebuf [8];
  size_t body_size_local;
  ptls_buffer_t *buf_local;
  
  sizebuf = (uint8_t  [8])body_size;
  puVar2 = ptls_encode_quicint((uint8_t *)&sizelen,body_size);
  __n = (long)puVar2 - (long)&sizelen;
  if (__n != 1) {
    iVar1 = ptls_buffer_reserve(buf,__n - 1);
    if (iVar1 != 0) {
      return iVar1;
    }
    memmove(buf->base + __n + (buf->off - (long)sizebuf) + -1,buf->base + (buf->off - (long)sizebuf)
            ,(size_t)sizebuf);
    buf->off = (__n - 1) + buf->off;
  }
  memcpy(buf->base + ((buf->off - (long)sizebuf) - __n),&sizelen,__n);
  return 0;
}

Assistant:

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf, size_t body_size)
{
    uint8_t sizebuf[PTLS_ENCODE_QUICINT_CAPACITY];
    size_t sizelen = ptls_encode_quicint(sizebuf, body_size) - sizebuf;

    /* adjust amount of space before body_size to `sizelen` bytes */
    if (sizelen != 1) {
        int ret;
        if ((ret = ptls_buffer_reserve(buf, sizelen - 1)) != 0)
            return ret;
        memmove(buf->base + buf->off - body_size - 1 + sizelen, buf->base + buf->off - body_size, body_size);
        buf->off += sizelen - 1;
    }

    /* write the size */
    memcpy(buf->base + buf->off - body_size - sizelen, sizebuf, sizelen);

    return 0;
}